

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

JavascriptMethod NativeCodeGenerator::CheckCodeGen(ScriptFunction *function)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode EVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  JavascriptMethod p_Var7;
  FunctionBody *this;
  ScriptContext *this_00;
  NativeCodeGenerator *manager;
  ThreadContext *pTVar8;
  FunctionEntryPointInfo *pFVar9;
  JobProcessor *pJVar10;
  ProxyEntryPointInfo *pPVar11;
  ProxyEntryPointInfo *pPVar12;
  JavascriptMethod local_80;
  JavascriptMethod defaultDirectEntryPoint;
  FunctionEntryPointInfo *defaultEntryPointInfo;
  FunctionEntryPointInfo *entryPoint;
  JavascriptMethod originalEntryPoint;
  NativeCodeGenerator *nativeCodeGen;
  ScriptContext *scriptContext;
  FunctionBody *functionBody;
  ScriptFunction *function_local;
  
  if (function == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x64f,"(function)","function");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  p_Var7 = Js::RecyclableObject::GetEntryPoint((RecyclableObject *)function);
  if (p_Var7 != CheckCodeGenThunk) {
    p_Var7 = Js::RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    bVar3 = Js::CrossSite::IsThunk(p_Var7);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0x651,
                         "(function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk || Js::CrossSite::IsThunk(function->GetEntryPoint()))"
                         ,
                         "function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk || Js::CrossSite::IsThunk(function->GetEntryPoint())"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  this_00 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  manager = Js::ScriptContext::GetNativeCodeGenerator(this_00);
  pTVar8 = Js::ScriptContext::GetThreadContext(this_00);
  bVar3 = ThreadContext::IsScriptActive(pTVar8);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x657,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pTVar8 = Js::ScriptContext::GetThreadContext(this_00);
  bVar3 = ThreadContext::IsInScript(pTVar8);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x658,"(scriptContext->GetThreadContext()->IsInScript())",
                       "scriptContext->GetThreadContext()->IsInScript()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_80 = Js::FunctionProxy::GetOriginalEntryPoint((FunctionProxy *)this);
  defaultEntryPointInfo = Js::ScriptFunction::GetFunctionEntryPointInfo(function);
  pFVar9 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this);
  if (defaultEntryPointInfo != pFVar9) {
    p_Var7 = Js::FunctionProxy::GetDirectEntryPoint
                       ((FunctionProxy *)this,(ProxyEntryPointInfo *)pFVar9);
    Js::ScriptFunction::UpdateThunkEntryPoint(function,pFVar9,p_Var7);
    p_Var7 = Js::FunctionProxy::GetDirectEntryPoint
                       ((FunctionProxy *)this,(ProxyEntryPointInfo *)pFVar9);
    bVar3 = IsThunk(p_Var7);
    defaultEntryPointInfo = pFVar9;
    if (!bVar3) {
      return p_Var7;
    }
  }
  if ((((DAT_01eafd98 & 1) != 0) &&
      (EVar4 = Js::FunctionBody::GetExecutionMode(this), EVar4 != SimpleJit)) &&
     (bVar3 = Js::FunctionBody::TryTransitionToJitExecutionMode(this), bVar3)) {
    pJVar10 = JsUtil::JobManager::Processor((JobManager *)manager);
    JsUtil::JobProcessor::PrioritizeJobAndWait<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
              (pJVar10,manager,defaultEntryPointInfo,function);
    p_Var7 = CheckCodeGenDone(this,defaultEntryPointInfo,function);
    return p_Var7;
  }
  pJVar10 = JsUtil::JobManager::Processor((JobManager *)manager);
  bVar3 = JsUtil::JobProcessor::PrioritizeJob<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
                    (pJVar10,manager,defaultEntryPointInfo,function);
  if (bVar3) {
    p_Var7 = CheckCodeGenDone(this,defaultEntryPointInfo,function);
    return p_Var7;
  }
  pPVar11 = Js::FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
  pPVar12 = Js::ScriptFunction::GetEntryPointInfo(function);
  if (pPVar11 == pPVar12) {
    if (((local_80 == Js::InterpreterStackFrame::DelayDynamicInterpreterThunk) ||
        (local_80 == Js::InterpreterStackFrame::StaticInterpreterThunk)) ||
       ((BVar5 = Js::ScriptContext::IsDynamicInterpreterThunk(this_00,local_80), BVar5 != 0 ||
        ((local_80 == Js::ScriptContext::ProfileModeDeferredParsingThunk ||
         (local_80 == Js::JavascriptFunction::DeferredParsingThunk)))))) goto LAB_008003fe;
    pFVar9 = Js::FunctionBody::GetSimpleJitEntryPointInfo(this);
    if (pFVar9 != (FunctionEntryPointInfo *)0x0) {
      pFVar9 = Js::FunctionBody::GetSimpleJitEntryPointInfo(this);
      p_Var7 = Js::EntryPointInfo::GetNativeEntrypoint(&pFVar9->super_EntryPointInfo);
      if (local_80 == p_Var7) goto LAB_008003fe;
    }
  }
  pFVar9 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this);
  uVar1 = pFVar9->entryPointIndex;
  pFVar9 = Js::ScriptFunction::GetFunctionEntryPointInfo(function);
  if (uVar1 <= pFVar9->entryPointIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x68f,
                       "(functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() && ( originalEntryPoint == Js::InterpreterStackFrame::DelayDynamicInterpreterThunk || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint) || (originalEntryPoint == Js::ScriptContext::ProfileModeDeferredParsingThunk) || originalEntryPoint == Js::JavascriptFunction::DeferredParsingThunk || ( functionBody->GetSimpleJitEntryPointInfo() && originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() ) ) || functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex)"
                       ,
                       "functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() && ( originalEntryPoint == DefaultEntryThunk || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint) || originalEntryPoint_IS_ProfileDeferredParsingThunk || originalEntryPoint == DefaultDeferredParsingThunk || ( functionBody->GetSimpleJitEntryPointInfo() && originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() ) ) || functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
LAB_008003fe:
  if (this_00->CurrentThunk == Js::ScriptContext::DebugProfileProbeThunk) {
    local_80 = Js::ScriptContext::DebugProfileProbeThunk;
  }
  return local_80;
}

Assistant:

Js::JavascriptMethod
NativeCodeGenerator::CheckCodeGen(Js::ScriptFunction * function)
{
    Assert(function);
    Assert(function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk
        || Js::CrossSite::IsThunk(function->GetEntryPoint()));
    // We are not expecting non-deserialized functions here; Error if it hasn't been deserialized by this point
    Js::FunctionBody *functionBody = function->GetFunctionBody();
    Js::ScriptContext *scriptContext = functionBody->GetScriptContext();

    NativeCodeGenerator *nativeCodeGen = scriptContext->GetNativeCodeGenerator();
    Assert(scriptContext->GetThreadContext()->IsScriptActive());
    Assert(scriptContext->GetThreadContext()->IsInScript());

    // Load the entry point here to validate it got changed afterwards
    Js::JavascriptMethod originalEntryPoint = functionBody->GetOriginalEntryPoint();
    Js::FunctionEntryPointInfo* entryPoint = function->GetFunctionEntryPointInfo();

    Js::FunctionEntryPointInfo *const defaultEntryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
    if(entryPoint != defaultEntryPointInfo)
    {
        // Switch to the latest entry point info
        function->UpdateThunkEntryPoint(defaultEntryPointInfo, functionBody->GetDirectEntryPoint(defaultEntryPointInfo));

        const Js::JavascriptMethod defaultDirectEntryPoint = functionBody->GetDirectEntryPoint(defaultEntryPointInfo);
        if(!IsThunk(defaultDirectEntryPoint))
        {
            return defaultDirectEntryPoint;
        }
        entryPoint = defaultEntryPointInfo;
    }

    // If a transition to JIT needs to be forced, JIT right away
    if(Js::Configuration::Global.flags.EnforceExecutionModeLimits &&
        functionBody->GetExecutionMode() != ExecutionMode::SimpleJit &&
        functionBody->TryTransitionToJitExecutionMode())
    {
        nativeCodeGen->Processor()->PrioritizeJobAndWait(nativeCodeGen, entryPoint, function);
        return CheckCodeGenDone(functionBody, entryPoint, function);
    }

    if(!nativeCodeGen->Processor()->PrioritizeJob(nativeCodeGen, entryPoint, function))
    {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
#define originalEntryPoint_IS_ProfileDeferredParsingThunk \
            (originalEntryPoint == ProfileDeferredParsingThunk)
#else
#define originalEntryPoint_IS_ProfileDeferredParsingThunk \
            false
#endif
        // Job was not yet processed
        // originalEntryPoint is the last known good entry point for the function body. Here we verify that
        // it either corresponds with this codegen episode (identified by function->entryPointIndex) of the function body
        // or one that was scheduled after. In the latter case originalEntryPoint will get updated if and when
        // that last episode completes successfully.
        Assert(functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() &&
            (
                originalEntryPoint == DefaultEntryThunk
             || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk
             || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint)
             || originalEntryPoint_IS_ProfileDeferredParsingThunk
             || originalEntryPoint == DefaultDeferredParsingThunk
             || (
                    functionBody->GetSimpleJitEntryPointInfo() &&
                    originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint()
                )
            ) ||
            functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex);
        return (scriptContext->CurrentThunk == ProfileEntryThunk) ? ProfileEntryThunk : originalEntryPoint;
    }

    return CheckCodeGenDone(functionBody, entryPoint, function);
}